

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

bool __thiscall basisu::etc1_optimizer::compute(etc1_optimizer *this)

{
  bool bVar1;
  uint uVar2;
  basis_etc_quality bVar3;
  params *ppVar4;
  uint32_t total_perms_to_try;
  uint8_t *__src;
  
  if (this->m_pResult->m_pSelectors == (uint8_t *)0x0) {
    __assert_fail("m_pResult->m_pSelectors",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x30a,"bool basisu::etc1_optimizer::compute()");
  }
  ppVar4 = this->m_pParams;
  if ((ppVar4->m_pForce_selectors != (uint8_t *)0x0) &&
     ((int)(ppVar4->super_basis_etc1_pack_params).m_quality < 2)) {
    __assert_fail("m_pParams->m_quality >= cETCQualitySlow",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x30e,"bool basisu::etc1_optimizer::compute()");
  }
  uVar2 = ppVar4->m_num_src_pixels;
  if ((ppVar4->super_basis_etc1_pack_params).m_cluster_fit == true) {
    bVar3 = (ppVar4->super_basis_etc1_pack_params).m_quality;
    if (bVar3 == cETCQualitySlow) {
      total_perms_to_try = 0x40;
    }
    else if (bVar3 == cETCQualityMedium) {
      total_perms_to_try = 0x10;
    }
    else if (bVar3 == cETCQualityFast) {
      total_perms_to_try = 4;
    }
    else {
      total_perms_to_try = 0xa5;
    }
    compute_internal_cluster_fit(this,total_perms_to_try);
  }
  else {
    compute_internal_neighborhood(this,this->m_br,this->m_bg,this->m_bb);
  }
  bVar1 = (this->m_best_solution).m_valid;
  if (bVar1 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    __src = this->m_pParams->m_pForce_selectors;
    if (__src == (uint8_t *)0x0) {
      if ((this->m_best_solution).m_selectors.m_size == 0) {
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,
                      "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]");
      }
      __src = (this->m_best_solution).m_selectors.m_p;
    }
    this->m_pResult->m_error = (this->m_best_solution).m_error;
    (this->m_pResult->m_block_color_unscaled).field_0 =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0;
    this->m_pResult->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    this->m_pResult->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(this->m_pResult->m_pSelectors,__src,(ulong)uVar2);
    this->m_pResult->m_n = uVar2;
  }
  return bVar1;
}

Assistant:

bool etc1_optimizer::compute()
	{
		assert(m_pResult->m_pSelectors);

		if (m_pParams->m_pForce_selectors)
		{
			assert(m_pParams->m_quality >= cETCQualitySlow);
			if (m_pParams->m_quality < cETCQualitySlow)
				return false;
		}

		const uint32_t n = m_pParams->m_num_src_pixels;

		if (m_pParams->m_cluster_fit)
		{
			if (m_pParams->m_quality == cETCQualityFast)
				compute_internal_cluster_fit(4);
			else if (m_pParams->m_quality == cETCQualityMedium)
				compute_internal_cluster_fit(16);
			else if (m_pParams->m_quality == cETCQualitySlow)
				compute_internal_cluster_fit(64);
			else
				compute_internal_cluster_fit(BASISU_ETC1_CLUSTER_FIT_ORDER_TABLE_SIZE);
		}
		else
			compute_internal_neighborhood(m_br, m_bg, m_bb);

		if (!m_best_solution.m_valid)
		{
			m_pResult->m_error = UINT32_MAX;
			return false;
		}

		//const uint8_t* pSelectors = &m_best_solution.m_selectors[0];
		const uint8_t* pSelectors = m_pParams->m_pForce_selectors ? m_pParams->m_pForce_selectors : &m_best_solution.m_selectors[0];

#if defined(DEBUG) || defined(_DEBUG)
		{
			// sanity check the returned error
			color_rgba block_colors[4];
			m_best_solution.m_coords.get_block_colors(block_colors);

			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
			uint64_t actual_error = 0;
			
			bool perceptual;
			if (m_pParams->m_quality >= cETCQualityMedium)
				perceptual = m_pParams->m_perceptual;
			else
				perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
						
			for (uint32_t i = 0; i < n; i++)
				actual_error += color_distance(perceptual, pSrc_pixels[i], block_colors[pSelectors[i]], false);

			assert(actual_error == m_best_solution.m_error);
		}
#endif      

		m_pResult->m_error = m_best_solution.m_error;

		m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
		m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

		m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
		memcpy(m_pResult->m_pSelectors, pSelectors, n);
		m_pResult->m_n = n;

		return true;
	}